

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O2

void __thiscall DQuitMenu::DQuitMenu(DQuitMenu *this,bool playsound)

{
  char *pcVar1;
  FString EndString;
  FString local_28;
  FName local_1c;
  
  local_1c.Index = 0;
  DMessageBoxMenu::DMessageBoxMenu
            (&this->super_DMessageBoxMenu,(DMenu *)0x0,(char *)0x0,0,false,&local_1c);
  (this->super_DMessageBoxMenu).super_DMenu.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_006e8828;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  local_28.Chars = FString::NullString.Nothing;
  pcVar1 = gameinfo.quitmessages.Array[(int)((uint)gametic % gameinfo.quitmessages.Count)].Chars;
  if (*pcVar1 == '$') {
    if (pcVar1[1] == '*') {
      pcVar1 = FStringTable::operator()(&GStrings,pcVar1 + 2);
      FString::operator=(&local_28,pcVar1);
    }
    else {
      pcVar1 = FStringTable::operator()(&GStrings,pcVar1 + 1);
      FStringTable::operator()(&GStrings,"DOSY");
      FString::Format(&local_28,"%s\n\n%s",pcVar1);
    }
  }
  else {
    FString::operator=(&local_28,
                       gameinfo.quitmessages.Array +
                       (int)((uint)gametic % gameinfo.quitmessages.Count));
  }
  DMessageBoxMenu::Init(&this->super_DMessageBoxMenu,(DMenu *)0x0,local_28.Chars,0,playsound);
  FString::~FString(&local_28);
  return;
}

Assistant:

DQuitMenu::DQuitMenu(bool playsound)
{
	int messageindex = gametic % gameinfo.quitmessages.Size();
	FString EndString;
	const char *msg = gameinfo.quitmessages[messageindex];
	if (msg[0] == '$') 
	{
		if (msg[1] == '*')
		{
			EndString = GStrings(msg+2);
		}
		else
		{
			EndString.Format("%s\n\n%s", GStrings(msg+1), GStrings("DOSY"));
		}
	}
	else EndString = gameinfo.quitmessages[messageindex];

	Init(NULL, EndString, 0, playsound);
}